

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O1

InverseKinematicsRotationParametrization __thiscall
iDynTree::InverseKinematics::rotationParametrization(InverseKinematics *this)

{
  iDynTree::reportError
            ("InverseKinematics","",
             "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics");
  return InverseKinematicsRotationParametrizationRollPitchYaw;
}

Assistant:

enum InverseKinematicsRotationParametrization InverseKinematics::rotationParametrization()
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->rotationParametrization();
#else
        missingIpoptErrorReport();
        return InverseKinematicsRotationParametrizationRollPitchYaw;
#endif
    }